

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

HierarchyInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token_const&,slang::syntax::ParameterValueAssignmentSyntax*&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token_const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ParameterValueAssignmentSyntax **args_2,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_3,Token *args_4)

{
  Token type;
  Token semi;
  HierarchyInstantiationSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> local_68;
  
  this_00 = (HierarchyInstantiationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchyInstantiationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (HierarchyInstantiationSyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  type.kind = args_1->kind;
  type._2_1_ = args_1->field_0x2;
  type.numFlags.raw = (args_1->numFlags).raw;
  type.rawLen = args_1->rawLen;
  type.info = args_1->info;
  local_68.elements._M_ptr = args_3->_M_ptr;
  local_68.super_SyntaxListBase.childCount = (args_3->_M_extent)._M_extent_value;
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e61f0;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  local_68.elements._M_extent._M_extent_value = local_68.super_SyntaxListBase.childCount;
  slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
            (this_00,args,type,*args_2,&local_68,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }